

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sswCnf.c
# Opt level: O0

int Ssw_CnfGetNodeValue(Ssw_Sat_t *p,Aig_Obj_t *pObj)

{
  int iVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  Aig_Obj_t *pAVar6;
  int nVarNum;
  int Value1;
  int Value0;
  Aig_Obj_t *pObj_local;
  Ssw_Sat_t *p_local;
  
  iVar1 = Aig_IsComplement(pObj);
  if (iVar1 != 0) {
    __assert_fail("!Aig_IsComplement(pObj)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/proof/ssw/sswCnf.c"
                  ,0x195,"int Ssw_CnfGetNodeValue(Ssw_Sat_t *, Aig_Obj_t *)");
  }
  iVar1 = Ssw_ObjSatNum(p,pObj);
  if (iVar1 < 1) {
    iVar1 = Aig_ObjIsCi(pObj);
    if (iVar1 == 0) {
      iVar1 = Aig_ObjIsNode(pObj);
      if (iVar1 == 0) {
        __assert_fail("Aig_ObjIsNode(pObj)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/proof/ssw/sswCnf.c"
                      ,0x19d,"int Ssw_CnfGetNodeValue(Ssw_Sat_t *, Aig_Obj_t *)");
      }
      pAVar6 = Aig_ObjFanin0(pObj);
      uVar2 = Ssw_CnfGetNodeValue(p,pAVar6);
      uVar3 = Aig_ObjFaninC0(pObj);
      pAVar6 = Aig_ObjFanin1(pObj);
      uVar4 = Ssw_CnfGetNodeValue(p,pAVar6);
      uVar5 = Aig_ObjFaninC1(pObj);
      p_local._4_4_ = (uVar3 ^ uVar2) & (uVar5 ^ uVar4);
    }
    else {
      p_local._4_4_ = 0;
    }
  }
  else {
    p_local._4_4_ = sat_solver_var_value(p->pSat,iVar1);
  }
  return p_local._4_4_;
}

Assistant:

int Ssw_CnfGetNodeValue( Ssw_Sat_t * p, Aig_Obj_t * pObj )
{
    int Value0, Value1, nVarNum;
    assert( !Aig_IsComplement(pObj) );
    nVarNum = Ssw_ObjSatNum( p, pObj );
    if ( nVarNum > 0 )
        return sat_solver_var_value( p->pSat, nVarNum );
//    if ( pObj->fMarkA == 1 )
//        return 0;
    if ( Aig_ObjIsCi(pObj) )
        return 0;
    assert( Aig_ObjIsNode(pObj) );
    Value0 = Ssw_CnfGetNodeValue( p, Aig_ObjFanin0(pObj) );
    Value0 ^= Aig_ObjFaninC0(pObj);
    Value1 = Ssw_CnfGetNodeValue( p, Aig_ObjFanin1(pObj) );
    Value1 ^= Aig_ObjFaninC1(pObj);
    return Value0 & Value1;
}